

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<int>::test_pow2_numerators<(libdivide::Branching)1>
          (DivideTest<int> *this,int denom,divider<int,_(libdivide::Branching)1> *the_divider)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int numer;
  
  uVar1 = 1;
  do {
    iVar3 = -1;
    iVar2 = 1 << (uVar1 & 0x1f);
    numer = 1 - iVar2;
    do {
      test_one<(libdivide::Branching)1>(this,iVar2 + iVar3,denom,the_divider);
      test_one<(libdivide::Branching)1>(this,numer,denom,the_divider);
      iVar3 = iVar3 + 1;
      numer = numer + -1;
    } while (iVar3 != 2);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x1f);
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }